

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::TrackFloatSymEquivalence(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BailOutKind BVar4;
  undefined4 *puVar5;
  Opnd *pOVar6;
  RegOpnd *pRVar7;
  JitArenaAllocator *pJVar8;
  FloatSymEquivalenceClass *this_00;
  BVSparse<Memory::JitArenaAllocator> *pBVar9;
  FloatSymEquivalenceClass *local_a0;
  FloatSymEquivalenceClass *dstEquivalenceClass;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  code *pcStack_78;
  BVIndex id;
  undefined8 local_70;
  TrackAllocData local_68;
  byte local_3a;
  byte local_39;
  bool srcHasEquivalenceClass;
  FloatSymEquivalenceClass *pFStack_38;
  bool dstHasEquivalenceClass;
  FloatSymEquivalenceClass *srcEquivalenceClass;
  FloatSymEquivalenceClass *dstEquivalenceClass_1;
  StackSym *src;
  StackSym *dst;
  Instr *instr_local;
  BackwardPass *this_local;
  
  dst = (StackSym *)instr;
  instr_local = (Instr *)this;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1db2,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((((this->tag == DeadStorePhase) &&
       (pOVar6 = IR::Instr::GetSrc2((Instr *)dst), pOVar6 == (Opnd *)0x0)) &&
      ((*(uint *)(*(long *)&dst->m_offset + 0x240) >> 4 & 1) != 0)) &&
     (pOVar6 = IR::Instr::GetDst((Instr *)dst), pOVar6 != (Opnd *)0x0)) {
    pOVar6 = IR::Instr::GetDst((Instr *)dst);
    bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
    if (bVar2) {
      pOVar6 = IR::Instr::GetDst((Instr *)dst);
      pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
      src = pRVar7->m_sym;
      bVar2 = StackSym::IsFloat64(src);
      if ((bVar2) && (pOVar6 = IR::Instr::GetSrc1((Instr *)dst), pOVar6 != (Opnd *)0x0)) {
        pOVar6 = IR::Instr::GetSrc1((Instr *)dst);
        bVar2 = IR::Opnd::IsRegOpnd(pOVar6);
        if (bVar2) {
          pOVar6 = IR::Instr::GetSrc1((Instr *)dst);
          pRVar7 = IR::Opnd::AsRegOpnd(pOVar6);
          dstEquivalenceClass_1 = (FloatSymEquivalenceClass *)pRVar7->m_sym;
          bVar2 = OpCodeAttr::NonIntTransfer(*(OpCode *)&dst->m_tempNumberSym);
          if ((bVar2) &&
             ((this->currentBlock->loop == (Loop *)0x0 || (bVar2 = IsPrePass(this), bVar2)))) {
            bVar2 = StackSym::IsFloat64((StackSym *)dstEquivalenceClass_1);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x1dcb,"(src->IsFloat64())","src->IsFloat64()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            if (src != (StackSym *)dstEquivalenceClass_1) {
              if ((this->func->m_fg->hasLoop & 1U) == 0) {
                if ((*(uint *)&src->field_0x18 >> 0x11 & 1) != 0) {
                  *(uint *)&(dstEquivalenceClass_1->bv).lastUsedNodePrevNextField =
                       *(uint *)&(dstEquivalenceClass_1->bv).lastUsedNodePrevNextField & 0xfffdffff
                       | 0x20000;
                }
              }
              else {
                srcEquivalenceClass = (FloatSymEquivalenceClass *)0x0;
                pFStack_38 = (FloatSymEquivalenceClass *)0x0;
                local_39 = JsUtil::
                           BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ::TryGetValue<unsigned_int>
                                     (this->floatSymEquivalenceMap,&(src->super_Sym).m_id,
                                      &srcEquivalenceClass);
                local_3a = JsUtil::
                           BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ::TryGetValue<unsigned_int>
                                     (this->floatSymEquivalenceMap,
                                      (uint *)&(dstEquivalenceClass_1->bv).alloc,
                                      &stack0xffffffffffffffc8);
                if ((local_39 & 1) == 0) {
                  if ((bool)local_3a) {
                    FloatSymEquivalenceClass::Set(pFStack_38,src);
                    JsUtil::
                    BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::Add(this->floatSymEquivalenceMap,&(src->super_Sym).m_id,
                          &stack0xffffffffffffffc8);
                    return;
                  }
                  pJVar8 = this->tempAlloc;
                  Memory::TrackAllocData::CreateTrackAllocData
                            (&local_68,(type_info *)&FloatSymEquivalenceClass::typeinfo,0,
                             0xffffffffffffffff,
                             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1deb);
                  pJVar8 = (JitArenaAllocator *)
                           Memory::
                           ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                           *)pJVar8,&local_68);
                  pcStack_78 = Memory::JitArenaAllocator::Alloc;
                  local_70 = 0;
                  this_00 = (FloatSymEquivalenceClass *)
                            new<Memory::JitArenaAllocator>(0x28,pJVar8,0x4e98c0);
                  FloatSymEquivalenceClass::FloatSymEquivalenceClass(this_00,this->tempAlloc);
                  srcEquivalenceClass = this_00;
                  FloatSymEquivalenceClass::Set(this_00,src);
                  JsUtil::
                  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Add(this->floatSymEquivalenceMap,&(src->super_Sym).m_id,&srcEquivalenceClass);
                }
                if ((local_3a & 1) == 0) {
                  FloatSymEquivalenceClass::Set
                            (srcEquivalenceClass,(StackSym *)dstEquivalenceClass_1);
                  JsUtil::
                  BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Add(this->floatSymEquivalenceMap,(uint *)&(dstEquivalenceClass_1->bv).alloc,
                        &srcEquivalenceClass);
                }
                else if (srcEquivalenceClass != pFStack_38) {
                  pBVar9 = FloatSymEquivalenceClass::Bv(srcEquivalenceClass);
                  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pBVar9,*(BVIndex *)&(dstEquivalenceClass_1->bv).alloc);
                  if (BVar3 != '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar5 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1dfd,"(!dstEquivalenceClass->Bv()->Test(src->m_id))",
                                       "!dstEquivalenceClass->Bv()->Test(src->m_id)");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar5 = 0;
                  }
                  pBVar9 = FloatSymEquivalenceClass::Bv(pFStack_38);
                  BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(pBVar9,(src->super_Sym).m_id);
                  if (BVar3 != '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar5 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                       ,0x1dfe,"(!srcEquivalenceClass->Bv()->Test(dst->m_id))",
                                       "!srcEquivalenceClass->Bv()->Test(dst->m_id)");
                    if (!bVar2) {
                      pcVar1 = (code *)invalidInstructionException();
                      (*pcVar1)();
                    }
                    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar5 = 0;
                  }
                  FloatSymEquivalenceClass::Or(srcEquivalenceClass,pFStack_38);
                  pBVar9 = FloatSymEquivalenceClass::Bv(pFStack_38);
                  for (__startIndex = pBVar9->head; __startIndex != (Type_conflict)0x0;
                      __startIndex = __startIndex->next) {
                    _unit.word._0_4_ = __startIndex->startIndex;
                    dstEquivalenceClass = (FloatSymEquivalenceClass *)(__startIndex->data).word;
                    _unit.word._4_4_ =
                         BVUnitT<unsigned_long>::GetNextBit
                                   ((BVUnitT<unsigned_long> *)&dstEquivalenceClass);
                    while (_unit.word._4_4_ != 0xffffffff) {
                      _curNode._4_4_ = (Type)_unit.word + _unit.word._4_4_;
                      BVUnitT<unsigned_long>::Clear
                                ((BVUnitT<unsigned_long> *)&dstEquivalenceClass,_unit.word._4_4_);
                      JsUtil::
                      BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      ::Item(this->floatSymEquivalenceMap,(uint *)((long)&_curNode + 4),
                             &srcEquivalenceClass);
                      _unit.word._4_4_ =
                           BVUnitT<unsigned_long>::GetNextBit
                                     ((BVUnitT<unsigned_long> *)&dstEquivalenceClass);
                    }
                    if (__startIndex == (Type_conflict)0x0) break;
                  }
                  Memory::
                  DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BackwardPass::FloatSymEquivalenceClass>
                            (this->tempAlloc,pFStack_38);
                }
              }
            }
          }
          else {
            bVar2 = IR::Instr::HasBailOutInfo((Instr *)dst);
            if ((bVar2) &&
               (BVar4 = IR::Instr::GetBailOutKind((Instr *)dst), BVar4 == BailOutPrimitiveButString)
               ) {
              if (*(short *)&dst->m_tempNumberSym != 0x1de) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x1e14,"(instr->m_opcode == Js::OpCode::FromVar)",
                                   "instr->m_opcode == Js::OpCode::FromVar");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 0;
              }
              local_a0 = (FloatSymEquivalenceClass *)0x0;
              if (((*(uint *)&src->field_0x18 >> 0x11 & 1) != 0) ||
                 ((bVar2 = JsUtil::
                           BaseDictionary<unsigned_int,_BackwardPass::FloatSymEquivalenceClass_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                           ::TryGetValue<unsigned_int>
                                     (this->floatSymEquivalenceMap,&(src->super_Sym).m_id,&local_a0)
                  , bVar2 &&
                  (bVar2 = FloatSymEquivalenceClass::RequiresBailOnNotNumber(local_a0), bVar2)))) {
                IR::Instr::SetBailOutKind((Instr *)dst,BailOutNumberOnly);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::TrackFloatSymEquivalence(IR::Instr *const instr)
{
    /*
    This function determines sets of float-specialized syms where any two syms in a set may have the same value number at some
    point in the function. Conversely, if two float-specialized syms are not in the same set, it guarantees that those two syms
    will never have the same value number. These sets are referred to as equivalence classes here.

    The equivalence class for a sym is used to determine whether a bailout FromVar generating a float value for the sym needs to
    bail out on any non-number value. For instance, for syms s1 and s5 in an equivalence class (say we have s5 = s1 at some
    point), if there's a FromVar that generates a float value for s1 but only bails out on strings or non-primitives, and s5 is
    returned from the function, it has to be ensured that s5 is not converted to Var. If the source of the FromVar was null, the
    FromVar would not have bailed out, and s1 and s5 would have the value +0. When s5 is returned, we need to return null and
    not +0, so the equivalence class is used to determine that since s5 requires a bailout on any non-number value, so does s1.

    The tracking is very conservative because the bit that says "I require bailout on any non-number value" is on the sym itself
    (referred to as non-number bailout bit below).

    Data:
    - BackwardPass::floatSymEquivalenceMap
        - hash table mapping a float sym ID to its equivalence class
    - FloatSymEquivalenceClass
        - bit vector of float sym IDs that are in the equivalence class
        - one non-number bailout bit for all syms in the equivalence class

    Algorithm:
    - In a loop prepass or when not in loop:
        - For a float sym transfer (s0.f = s1.f), add both syms to an equivalence class (set the syms in a bit vector)
            - If either sym requires bailout on any non-number value, set the equivalence class' non-number bailout bit
        - If one of the syms is already in an equivalence class, merge the two equivalence classes by OR'ing the two bit vectors
          and the non-number bailout bit.
        - Note that for functions with a loop, dependency tracking is done using equivalence classes and that information is not
          transferred back into each sym's non-number bailout bit
    - In a loop non-prepass or when not in loop, for a FromVar instruction that requires bailout only on strings and
      non-primitives:
        - If the destination float sym's non-number bailout bit is set, or the sym is in an equivalence class whose non-number
          bailout bit is set, change the bailout to bail out on any non-number value

    The result is that if a float-specialized sym's value is used in a way in which it would be invalid to use the float value
    through any other float-specialized sym that acquires the value, the FromVar generating the float value will be modified to
    bail out on any non-number value.
    */

    Assert(instr);

    if(tag != Js::DeadStorePhase || instr->GetSrc2() || !instr->m_func->hasBailout)
    {
        return;
    }

    if(!instr->GetDst() || !instr->GetDst()->IsRegOpnd())
    {
        return;
    }
    const auto dst = instr->GetDst()->AsRegOpnd()->m_sym;
    if(!dst->IsFloat64())
    {
        return;
    }

    if(!instr->GetSrc1() || !instr->GetSrc1()->IsRegOpnd())
    {
        return;
    }
    const auto src = instr->GetSrc1()->AsRegOpnd()->m_sym;

    if(OpCodeAttr::NonIntTransfer(instr->m_opcode) && (!currentBlock->loop || IsPrePass()))
    {
        Assert(src->IsFloat64()); // dst is specialized, and since this is a float transfer, src must be specialized too

        if(dst == src)
        {
            return;
        }

        if(!func->m_fg->hasLoop)
        {
            // Special case for functions with no loops, since there can only be in-order dependencies. Just merge the two
            // non-number bailout bits and put the result in the source.
            if(dst->m_requiresBailOnNotNumber)
            {
                src->m_requiresBailOnNotNumber = true;
            }
            return;
        }

        FloatSymEquivalenceClass *dstEquivalenceClass = nullptr, *srcEquivalenceClass = nullptr;
        const bool dstHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass);
        const bool srcHasEquivalenceClass = floatSymEquivalenceMap->TryGetValue(src->m_id, &srcEquivalenceClass);

        if(!dstHasEquivalenceClass)
        {
            if(srcHasEquivalenceClass)
            {
                // Just add the destination into the source's equivalence class
                srcEquivalenceClass->Set(dst);
                floatSymEquivalenceMap->Add(dst->m_id, srcEquivalenceClass);
                return;
            }

            dstEquivalenceClass = JitAnew(tempAlloc, FloatSymEquivalenceClass, tempAlloc);
            dstEquivalenceClass->Set(dst);
            floatSymEquivalenceMap->Add(dst->m_id, dstEquivalenceClass);
        }

        if(!srcHasEquivalenceClass)
        {
            // Just add the source into the destination's equivalence class
            dstEquivalenceClass->Set(src);
            floatSymEquivalenceMap->Add(src->m_id, dstEquivalenceClass);
            return;
        }

        if(dstEquivalenceClass == srcEquivalenceClass)
        {
            return;
        }

        Assert(!dstEquivalenceClass->Bv()->Test(src->m_id));
        Assert(!srcEquivalenceClass->Bv()->Test(dst->m_id));

        // Merge the two equivalence classes. The source's equivalence class is typically smaller, so it's merged into the
        // destination's equivalence class. To save space and prevent a potential explosion of bit vector size,
        // 'floatSymEquivalenceMap' is updated for syms in the source's equivalence class to map to the destination's now merged
        // equivalence class, and the source's equivalence class is discarded.
        dstEquivalenceClass->Or(srcEquivalenceClass);
        FOREACH_BITSET_IN_SPARSEBV(id, srcEquivalenceClass->Bv())
        {
            floatSymEquivalenceMap->Item(id, dstEquivalenceClass);
        } NEXT_BITSET_IN_SPARSEBV;
        JitAdelete(tempAlloc, srcEquivalenceClass);

        return;
    }

    // Not a float transfer, and non-prepass (not necessarily in a loop)

    if(!instr->HasBailOutInfo() || instr->GetBailOutKind() != IR::BailOutPrimitiveButString)
    {
        return;
    }
    Assert(instr->m_opcode == Js::OpCode::FromVar);

    // If either the destination or its equivalence class says it requires bailout on any non-number value, adjust the bailout
    // kind on the instruction. Both are checked because in functions without loops, equivalence tracking is not done and only
    // the sym's non-number bailout bit will have the information, and in functions with loops, equivalence tracking is done
    // throughout the function and checking just the sym's non-number bailout bit is insufficient.
    FloatSymEquivalenceClass *dstEquivalenceClass = nullptr;
    if(dst->m_requiresBailOnNotNumber ||
        (floatSymEquivalenceMap->TryGetValue(dst->m_id, &dstEquivalenceClass) && dstEquivalenceClass->RequiresBailOnNotNumber()))
    {
        instr->SetBailOutKind(IR::BailOutNumberOnly);
    }
}